

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O3

int op_test_open(OggOpusFile *_of)

{
  int iVar1;
  int iVar2;
  
  if (_of->ready_state == 1) {
    iVar1 = op_open2(_of);
    iVar2 = 0;
    if (iVar1 < 0) {
      memset(_of,0,0x3390);
      iVar2 = iVar1;
    }
    return iVar2;
  }
  return -0x83;
}

Assistant:

int op_test_open(OggOpusFile *_of){
  int ret;
  if(OP_UNLIKELY(_of->ready_state!=OP_PARTOPEN))return OP_EINVAL;
  ret=op_open2(_of);
  /*op_open2() will clear this structure on failure.
    Reset its contents to prevent double-frees in op_free().*/
  if(OP_UNLIKELY(ret<0))memset(_of,0,sizeof(*_of));
  return ret;
}